

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

char * __thiscall rtosc::Port::MetaContainer::operator[](MetaContainer *this,char *str)

{
  int iVar1;
  MetaIterator __begin1;
  MetaIterator local_40;
  MetaIterator local_30;
  
  local_40 = begin(this);
  MetaIterator::MetaIterator(&local_30,(char *)0x0);
  if (local_40.title != local_30.title) {
    do {
      iVar1 = strcmp(local_40.title,str);
      if (iVar1 == 0) {
        return local_40.value;
      }
      MetaIterator::operator++(&local_40);
    } while (local_40.title != local_30.title);
  }
  return (char *)0x0;
}

Assistant:

const char *Port::MetaContainer::operator[](const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x.value;
    return NULL;
}